

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::ExecuteTests(cmCTest *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  cmCTestGenericHandler **handler;
  ostream *poVar5;
  int unaff_EBP;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var6;
  string currDir;
  string workDir;
  char *local_1b0 [4];
  ostringstream cmCTestLog_msg;
  long *local_188;
  
  _Var6._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if ((_Var6._M_head_impl)->RunConfigurationScript == true) {
    if ((_Var6._M_head_impl)->ExtraVerbose == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"* Extra verbosity turned on");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::stringbuf::str();
      Log(this,1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xb37,currDir._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&currDir);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      _Var6._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    }
    Private::GetTestingHandlers
              ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
               &cmCTestLog_msg,_Var6._M_head_impl);
    _Var6._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    for (; (long *)_cmCTestLog_msg != local_188; _cmCTestLog_msg = _cmCTestLog_msg + 8) {
      lVar1 = *(long *)_cmCTestLog_msg;
      *(uint *)(lVar1 + 0x18) = (uint)(_Var6._M_head_impl)->ExtraVerbose;
      *(int *)(lVar1 + 0x118) = (_Var6._M_head_impl)->SubmitIndex;
    }
    std::_Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::
    ~_Vector_base((_Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *
                  )&cmCTestLog_msg);
    _Var6._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    *(uint *)((long)&(_Var6._M_head_impl)->ScriptHandler + 0x18) =
         (uint)(_Var6._M_head_impl)->Verbose;
    unaff_EBP = (**(code **)(*(long *)&((_Var6._M_head_impl)->ScriptHandler).
                                       super_cmCTestGenericHandler + 8))
                          (&(_Var6._M_head_impl)->ScriptHandler);
    if (unaff_EBP == 0) {
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"running script failing returning: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,unaff_EBP);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0xb41,currDir._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&currDir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  else {
    (_Var6._M_head_impl)->ExtraVerbose = (_Var6._M_head_impl)->Verbose;
    (_Var6._M_head_impl)->Verbose = true;
    Private::GetTestingHandlers
              ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
               &cmCTestLog_msg,_Var6._M_head_impl);
    _Var6._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    for (; (long *)_cmCTestLog_msg != local_188; _cmCTestLog_msg = _cmCTestLog_msg + 8) {
      lVar1 = *(long *)_cmCTestLog_msg;
      *(uint *)(lVar1 + 0x18) = (uint)(_Var6._M_head_impl)->Verbose;
      *(int *)(lVar1 + 0x118) = (_Var6._M_head_impl)->SubmitIndex;
    }
    std::_Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::
    ~_Vector_base((_Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *
                  )&cmCTestLog_msg);
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    std::__cxx11::string::string((string *)&workDir,(string *)&currDir);
    _Var6._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (*(size_type *)((long)&(_Var6._M_head_impl)->TestDir + 8) != 0) {
      cmsys::SystemTools::CollapseFullPath((string *)&cmCTestLog_msg,&(_Var6._M_head_impl)->TestDir)
      ;
      std::__cxx11::string::operator=((string *)&workDir,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
    bVar2 = std::operator!=(&currDir,&workDir);
    if ((!bVar2) || (bVar2 = TryToChangeDirectory(this,&workDir), bVar2)) {
      iVar4 = Initialize(this,workDir._M_dataplus._M_p,(cmCTestStartCommand *)0x0);
      if (iVar4 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Problem initializing the dashboard.");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0xb5d,local_1b0[0],false);
        std::__cxx11::string::~string((string *)local_1b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        unaff_EBP = 0xc;
      }
      else {
        unaff_EBP = ProcessSteps(this);
      }
      bVar3 = std::operator!=(&currDir,&workDir);
      bVar2 = true;
      if (bVar3) {
        cmsys::SystemTools::ChangeDirectory(&currDir);
      }
    }
    else {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&workDir);
    std::__cxx11::string::~string((string *)&currDir);
    if (!bVar2) {
      return 1;
    }
    if (unaff_EBP == 0) {
      return 0;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Running a test(s) failed returning : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,unaff_EBP);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0xb69,currDir._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&currDir);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  return unaff_EBP;
}

Assistant:

int cmCTest::ExecuteTests()
{
  int res;
  // call process directory
  if (this->Impl->RunConfigurationScript) {
    if (this->Impl->ExtraVerbose) {
      cmCTestLog(this, OUTPUT, "* Extra verbosity turned on" << std::endl);
    }
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      handler->SetVerbose(this->Impl->ExtraVerbose);
      handler->SetSubmitIndex(this->Impl->SubmitIndex);
    }
    this->GetScriptHandler()->SetVerbose(this->Impl->Verbose);
    res = this->GetScriptHandler()->ProcessHandler();
    if (res != 0) {
      cmCTestLog(this, DEBUG,
                 "running script failing returning: " << res << std::endl);
    }

  } else {
    // What is this?  -V seems to be the same as -VV,
    // and Verbose is always on in this case
    this->Impl->ExtraVerbose = this->Impl->Verbose;
    this->Impl->Verbose = true;
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      handler->SetVerbose(this->Impl->Verbose);
      handler->SetSubmitIndex(this->Impl->SubmitIndex);
    }

    const std::string currDir = cmSystemTools::GetCurrentWorkingDirectory();
    std::string workDir = currDir;
    if (!this->Impl->TestDir.empty()) {
      workDir = cmSystemTools::CollapseFullPath(this->Impl->TestDir);
    }

    if (currDir != workDir) {
      if (!this->TryToChangeDirectory(workDir)) {
        return 1;
      }
    }

    if (!this->Initialize(workDir.c_str(), nullptr)) {
      res = 12;
      cmCTestLog(this, ERROR_MESSAGE,
                 "Problem initializing the dashboard." << std::endl);
    } else {
      res = this->ProcessSteps();
    }
    this->Finalize();

    if (currDir != workDir) {
      cmSystemTools::ChangeDirectory(currDir);
    }
  }
  if (res != 0) {
    cmCTestLog(this, DEBUG,
               "Running a test(s) failed returning : " << res << std::endl);
  }
  return res;
}